

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  ImFontConfig *pIVar1;
  void *__dest;
  ImFont *pIVar2;
  long lVar3;
  ImFont *local_20;
  
  if (font_cfg->MergeMode == false) {
    local_20 = (ImFont *)ImGui::MemAlloc(0x78);
    (local_20->IndexAdvanceX).Size = 0;
    (local_20->IndexAdvanceX).Capacity = 0;
    (local_20->IndexAdvanceX).Data = (float *)0x0;
    local_20->FallbackAdvanceX = 0.0;
    local_20->FontSize = 0.0;
    (local_20->IndexLookup).Size = 0;
    (local_20->IndexLookup).Capacity = 0;
    (local_20->IndexLookup).Data = (unsigned_short *)0x0;
    (local_20->Glyphs).Size = 0;
    (local_20->Glyphs).Capacity = 0;
    (local_20->Glyphs).Data = (ImFontGlyph *)0x0;
    local_20->FallbackChar = 0xffff;
    local_20->EllipsisChar = 0xffff;
    local_20->FallbackGlyph = (ImFontGlyph *)0x0;
    local_20->ContainerAtlas = (ImFontAtlas *)0x0;
    *(undefined8 *)((long)&local_20->ContainerAtlas + 2) = 0;
    *(undefined8 *)((long)&local_20->ConfigData + 2) = 0;
    *(undefined8 *)&local_20->EllipsisCharCount = 0;
    *(undefined4 *)((long)&local_20->EllipsisCharStep + 1) = 0;
    local_20->Scale = 1.0;
    local_20->Ascent = 0.0;
    local_20->Descent = 0.0;
    *(undefined8 *)((long)&local_20->Descent + 2) = 0;
    ImVector<ImFont_*>::push_back(&this->Fonts,&local_20);
  }
  ImVector<ImFontConfig>::push_back(&this->ConfigData,font_cfg);
  pIVar1 = (this->ConfigData).Data;
  lVar3 = (long)(this->ConfigData).Size;
  pIVar2 = pIVar1[lVar3 + -1].DstFont;
  if (pIVar2 == (ImFont *)0x0) {
    pIVar2 = (this->Fonts).Data[(long)(this->Fonts).Size + -1];
    pIVar1[lVar3 + -1].DstFont = pIVar2;
  }
  if (pIVar1[lVar3 + -1].FontDataOwnedByAtlas == false) {
    __dest = ImGui::MemAlloc((long)pIVar1[lVar3 + -1].FontDataSize);
    pIVar1[lVar3 + -1].FontData = __dest;
    pIVar1[lVar3 + -1].FontDataOwnedByAtlas = true;
    memcpy(__dest,font_cfg->FontData,(long)pIVar1[lVar3 + -1].FontDataSize);
    pIVar2 = pIVar1[lVar3 + -1].DstFont;
  }
  if (pIVar2->EllipsisChar == 0xffff) {
    pIVar2->EllipsisChar = font_cfg->EllipsisChar;
  }
  ImFontAtlasUpdateConfigDataPointers(this);
  this->TexReady = false;
  ClearTexData(this);
  return pIVar1[lVar3 + -1].DstFont;
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = IM_ALLOC(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    if (new_font_cfg.DstFont->EllipsisChar == (ImWchar)-1)
        new_font_cfg.DstFont->EllipsisChar = font_cfg->EllipsisChar;

    ImFontAtlasUpdateConfigDataPointers(this);

    // Invalidate texture
    TexReady = false;
    ClearTexData();
    return new_font_cfg.DstFont;
}